

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O0

bool __thiscall Js::JavascriptMap::Delete(JavascriptMap *this,Var key)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  ScriptContext *this_00;
  ThreadContext *threadContext;
  undefined4 *puVar4;
  undefined1 local_40 [8];
  JsReentLock jsReentLock;
  Var key_local;
  JavascriptMap *this_local;
  
  jsReentLock._24_8_ = key;
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  threadContext = ScriptContext::GetThreadContext(this_00);
  JsReentLock::JsReentLock((JsReentLock *)local_40,threadContext);
  TVar1 = this->kind;
  if (TVar1 == EmptyMap) {
    this_local._7_1_ = false;
  }
  else if (TVar1 == SimpleVarMap) {
    this_local._7_1_ = DeleteFromSimpleVarMap(this,(Var)jsReentLock._24_8_);
  }
  else if (TVar1 == ComplexVarMap) {
    this_local._7_1_ = DeleteFromVarMap<true>(this,(Var)jsReentLock._24_8_);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMap.cpp"
                                ,0x18a,"((0))","(0)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
    this_local._7_1_ = false;
  }
  JsReentLock::~JsReentLock((JsReentLock *)local_40);
  return this_local._7_1_;
}

Assistant:

bool
JavascriptMap::Delete(Var key)
{
    JS_REENTRANCY_LOCK(jsReentLock, this->GetScriptContext()->GetThreadContext());

    switch (this->kind)
    {
    case MapKind::EmptyMap:
        return false;

    case MapKind::SimpleVarMap:
        return this->DeleteFromSimpleVarMap(key);
    case MapKind::ComplexVarMap:
        return this->DeleteFromVarMap<true>(key);
    default:
        Assume(UNREACHED);
        return false;
    }
}